

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void __thiscall
btSortedOverlappingPairCache::btSortedOverlappingPairCache(btSortedOverlappingPairCache *this)

{
  undefined8 *in_RDI;
  int initialAllocatedSize;
  btOverlappingPairCache *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  btAlignedObjectArray<btBroadphasePair> *in_stack_fffffffffffffff0;
  
  btOverlappingPairCache::btOverlappingPairCache(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__btSortedOverlappingPairCache_002e21d8;
  btAlignedObjectArray<btBroadphasePair>::btAlignedObjectArray
            ((btAlignedObjectArray<btBroadphasePair> *)(in_RDI + 1));
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 1;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  btAlignedObjectArray<btBroadphasePair>::reserve
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  return;
}

Assistant:

btSortedOverlappingPairCache::btSortedOverlappingPairCache():
	m_blockedForChanges(false),
	m_hasDeferredRemoval(true),
	m_overlapFilterCallback(0),
	m_ghostPairCallback(0)
{
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}